

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZManVector<double,_3>,_10>::TPZManVector
          (TPZManVector<TPZManVector<double,_3>,_10> *this,int64_t size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int64_t *piVar3;
  int64_t iVar4;
  TPZManVector<double,_3> *pTVar5;
  long lVar6;
  TPZManVector<double,_3> *pTVar7;
  ulong uVar8;
  
  lVar6 = 0;
  TPZVec<TPZManVector<double,_3>_>::TPZVec(&this->super_TPZVec<TPZManVector<double,_3>_>,0);
  (this->super_TPZVec<TPZManVector<double,_3>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_017a5440;
  pTVar5 = (TPZManVector<double,_3> *)&this->field_0x20;
  pTVar7 = pTVar5;
  do {
    TPZManVector<double,_3>::TPZManVector(pTVar7,0);
    lVar6 = lVar6 + -0x38;
    pTVar7 = pTVar7 + 1;
  } while (lVar6 != -0x230);
  if (size < 0xb) {
    iVar4 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = size;
    uVar2 = SUB168(auVar1 * ZEXT816(0x38),0);
    uVar8 = uVar2 + 8;
    if (0xfffffffffffffff7 < uVar2) {
      uVar8 = 0xffffffffffffffff;
    }
    if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
      uVar8 = 0xffffffffffffffff;
    }
    piVar3 = (int64_t *)operator_new__(uVar8);
    *piVar3 = size;
    pTVar5 = (TPZManVector<double,_3> *)(piVar3 + 1);
    lVar6 = 0;
    pTVar7 = pTVar5;
    do {
      TPZManVector<double,_3>::TPZManVector(pTVar7,0);
      lVar6 = lVar6 + -0x38;
      pTVar7 = pTVar7 + 1;
      iVar4 = size;
    } while (size * -0x38 - lVar6 != 0);
  }
  (this->super_TPZVec<TPZManVector<double,_3>_>).fStore = pTVar5;
  (this->super_TPZVec<TPZManVector<double,_3>_>).fNElements = size;
  (this->super_TPZVec<TPZManVector<double,_3>_>).fNAlloc = iVar4;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}